

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

error_code __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
set_option_no_delay(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>
                    *this,bool b,error_code *ec)

{
  byte in_SIL;
  AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *in_RDI;
  error_code eVar1;
  boolean<6,_1> *in_stack_ffffffffffffffb8;
  boolean<6,_1> local_2c [4];
  undefined1 local_19;
  
  local_19 = in_SIL & 1;
  asio::detail::socket_option::boolean<6,_1>::boolean(local_2c,(bool)local_19);
  eVar1 = AsioSocket<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>::
          set_option<asio::detail::socket_option::boolean<6,1>>
                    (in_RDI,in_stack_ffffffffffffffb8,(error_code *)0x77346c);
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

std::error_code set_option_no_delay(bool b, std::error_code& ec)
    {
        return set_option(asio::ip::tcp::no_delay(b), ec);
    }